

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::AggregationValidator_validateTrace_result::write
          (AggregationValidator_validateTrace_result *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  uint32_t local_1c;
  uint32_t xfer;
  TProtocol *oprot_local;
  AggregationValidator_validateTrace_result *this_local;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  local_1c = apache::thrift::protocol::TProtocol::writeStructBegin
                       (this_00,"AggregationValidator_validateTrace_result");
  if (((byte)this->__isset & 1) != 0) {
    __n_00 = 0;
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin(this_00,"success",T_STRUCT,0);
    sVar3 = ValidateTraceResponse::write(&this->success,__fd,__buf_00,__n_00);
    uVar2 = apache::thrift::protocol::TProtocol::writeFieldEnd(this_00);
    local_1c = uVar2 + (int)sVar3 + uVar1 + local_1c;
  }
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldStop(this_00);
  uVar2 = apache::thrift::protocol::TProtocol::writeStructEnd(this_00);
  return (ulong)(uVar2 + uVar1 + local_1c);
}

Assistant:

uint32_t AggregationValidator_validateTrace_result::write(::apache::thrift::protocol::TProtocol* oprot) const {

  uint32_t xfer = 0;

  xfer += oprot->writeStructBegin("AggregationValidator_validateTrace_result");

  if (this->__isset.success) {
    xfer += oprot->writeFieldBegin("success", ::apache::thrift::protocol::T_STRUCT, 0);
    xfer += this->success.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}